

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

bool __thiscall FButtonStatus::ReleaseKey(FButtonStatus *this,int keynum)

{
  BYTE BVar1;
  int local_28;
  int iStack_24;
  BYTE wasdown;
  int match;
  int numdown;
  int i;
  int keynum_local;
  FButtonStatus *this_local;
  
  BVar1 = this->bDown;
  if ((keynum & 0x7fffU) == 0) {
    for (match = 5; -1 < match; match = match + -1) {
      this->Keys[match] = 0;
    }
    this->bWentUp = '\x01';
    this->bDown = '\0';
  }
  else {
    iStack_24 = 0;
    local_28 = -1;
    for (match = 5; -1 < match; match = match + -1) {
      if ((this->Keys[match] != 0) &&
         (iStack_24 = iStack_24 + 1, (uint)this->Keys[match] == (keynum & 0x7fffU))) {
        local_28 = match;
      }
    }
    if (local_28 < 0) {
      return false;
    }
    this->Keys[local_28] = 0;
    this->bWentUp = '\x01';
    if (iStack_24 == 1) {
      this->bDown = '\0';
    }
  }
  this_local._7_1_ = false;
  if (BVar1 != '\0') {
    this_local._7_1_ = this->bDown == '\0';
  }
  return this_local._7_1_;
}

Assistant:

bool FButtonStatus::ReleaseKey (int keynum)
{
	int i, numdown, match;
	BYTE wasdown = bDown;

	keynum &= KEY_DBLCLICKED-1;

	if (keynum == 0)
	{ // Issued from console instead of a key, so force off
		for (i = MAX_KEYS-1; i >= 0; --i)
		{
			Keys[i] = 0;
		}
		bWentUp = true;
		bDown = false;
	}
	else
	{
		for (i = MAX_KEYS-1, numdown = 0, match = -1; i >= 0; --i)
		{
			if (Keys[i] != 0)
			{
				++numdown;
				if (Keys[i] == keynum)
				{
					match = i;
				}
			}
		}
		if (match < 0)
		{ // Key was not down; do nothing
			return false;
		}
		Keys[match] = 0;
		bWentUp = true;
		if (--numdown == 0)
		{
			bDown = false;
		}
	}
	// Returns true if releasing this key caused the button to go up.
	return wasdown && !bDown;
}